

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O0

void __thiscall
wasm::GlobalTypeRewriter::mapTypes(std::unordered_map<wasm::HeapType,wasm::HeapType,std::hash<wasm::
HeapType>,std::equal_to<wasm::HeapType>,std::allocator<std::pair<wasm::HeapType_const,wasm::
HeapType>>>const&)::CodeUpdater::visitExpression(wasm::Expression__(void *this,Expression *curr)

{
  bool bVar1;
  Function *pFVar2;
  Type TVar3;
  Block *pBVar4;
  Call *pCVar5;
  CallIndirect *pCVar6;
  HeapType HVar7;
  Store *pSVar8;
  AtomicWait *pAVar9;
  MemorySize *pMVar10;
  MemoryGrow *pMVar11;
  Try *pTVar12;
  Throw *pTVar13;
  TupleMake *pTVar14;
  CallRef *pCVar15;
  RefTest *pRVar16;
  BrOn *pBVar17;
  StructNew *pSVar18;
  ArrayNewFixed *pAVar19;
  size_t sVar20;
  bool local_3b9;
  StringSliceIter *cast_84;
  StringSliceWTF *cast_83;
  StringIterMove *cast_82;
  StringIterNext *cast_81;
  StringWTF16Get *cast_80;
  StringWTF8Advance *cast_79;
  StringAs *cast_78;
  StringEq *cast_77;
  StringConcat *cast_76;
  StringEncode *cast_75;
  StringMeasure *cast_74;
  StringConst *cast_73;
  StringNew *cast_72;
  RefAs *cast_71;
  ArrayInit *cast_70;
  ArrayFill *cast_69;
  ArrayCopy *cast_68;
  ArrayLen *cast_67;
  ArraySet *cast_66;
  ArrayGet *cast_65;
  int i_8;
  ArrayNewFixed *cast_64;
  ArrayNewSeg *cast_63;
  ArrayNew *cast_62;
  StructSet *cast_61;
  StructGet *cast_60;
  int i_7;
  StructNew *cast_59;
  BrOn *cast_58;
  RefCast *cast_57;
  RefTest *cast_56;
  int i_6;
  CallRef *cast_55;
  I31Get *cast_54;
  I31New *cast_53;
  TupleExtract *cast_52;
  int i_5;
  TupleMake *cast_51;
  Pop *cast_50;
  Unreachable *cast_49;
  Nop *cast_48;
  Rethrow *cast_47;
  int i_4;
  Throw *cast_46;
  int i_3;
  Try *cast_45;
  TableGrow *cast_44;
  TableSize *cast_43;
  TableSet *cast_42;
  TableGet *cast_41;
  RefEq *cast_40;
  RefFunc *cast_39;
  RefIsNull *cast_38;
  RefNull *cast_37;
  MemoryGrow *cast_36;
  MemorySize *cast_35;
  Return *cast_34;
  Drop *cast_33;
  Select *cast_32;
  Binary *cast_31;
  Unary *cast_30;
  Const *cast_29;
  MemoryFill *cast_28;
  MemoryCopy *cast_27;
  DataDrop *cast_26;
  MemoryInit *cast_25;
  SIMDLoadStoreLane *cast_24;
  SIMDLoad *cast_23;
  SIMDShift *cast_22;
  SIMDTernary *cast_21;
  SIMDShuffle *cast_20;
  SIMDReplace *cast_19;
  SIMDExtract *cast_18;
  AtomicFence *cast_17;
  AtomicNotify *cast_16;
  AtomicWait *cast_15;
  AtomicCmpxchg *cast_14;
  AtomicRMW *cast_13;
  Store *cast_12;
  Load *cast_11;
  GlobalSet *cast_10;
  GlobalGet *cast_9;
  LocalSet *cast_8;
  LocalGet *cast_7;
  int local_9c;
  int i_2;
  CallIndirect *cast_6;
  int i_1;
  Call *cast_5;
  Switch *cast_4;
  Break *cast_3;
  Loop *cast_2;
  If *cast_1;
  int i;
  Block *cast;
  BasicType local_38 [2];
  LocalSet *local_30;
  LocalSet *tee;
  LocalGet *local_20;
  LocalGet *get;
  Expression *curr_local;
  CodeUpdater *this_local;
  
  get = (LocalGet *)curr;
  curr_local = (Expression *)this;
  local_20 = Expression::dynCast<wasm::LocalGet>(curr);
  if (local_20 == (LocalGet *)0x0) {
    local_30 = Expression::dynCast<wasm::LocalSet>((Expression *)get);
    if (local_30 == (LocalSet *)0x0) {
      TVar3 = getNew(wasm::Type_(this,(get->super_SpecificExpression<(wasm::Expression::Id)8>).
                                      super_Expression.type.id);
      (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar3.id;
      switch((get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression._id) {
      case InvalidId:
      case NumExpressionIds:
        handle_unreachable("unexpected expression type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                           ,0xb0);
      case BlockId:
        pBVar4 = Expression::cast<wasm::Block>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pBVar4->list).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_1._4_4_ = (int)sVar20;
        do {
          cast_1._4_4_ = cast_1._4_4_ + -1;
        } while (-1 < cast_1._4_4_);
        break;
      case IfId:
        Expression::cast<wasm::If>((Expression *)get);
        break;
      case LoopId:
        Expression::cast<wasm::Loop>((Expression *)get);
        break;
      case BreakId:
        Expression::cast<wasm::Break>((Expression *)get);
        break;
      case SwitchId:
        Expression::cast<wasm::Switch>((Expression *)get);
        break;
      case CallId:
        pCVar5 = Expression::cast<wasm::Call>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pCVar5->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_6._4_4_ = (int)sVar20;
        do {
          cast_6._4_4_ = cast_6._4_4_ + -1;
        } while (-1 < cast_6._4_4_);
        break;
      case CallIndirectId:
        pCVar6 = Expression::cast<wasm::CallIndirect>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pCVar6->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        local_9c = (int)sVar20;
        do {
          local_9c = local_9c + -1;
        } while (-1 < local_9c);
        HVar7 = getNew(wasm::HeapType_(this,(pCVar6->heapType).id);
        (pCVar6->heapType).id = HVar7.id;
        break;
      case LocalGetId:
        Expression::cast<wasm::LocalGet>((Expression *)get);
        break;
      case LocalSetId:
        Expression::cast<wasm::LocalSet>((Expression *)get);
        break;
      case GlobalGetId:
        Expression::cast<wasm::GlobalGet>((Expression *)get);
        break;
      case GlobalSetId:
        Expression::cast<wasm::GlobalSet>((Expression *)get);
        break;
      case LoadId:
        Expression::cast<wasm::Load>((Expression *)get);
        break;
      case StoreId:
        pSVar8 = Expression::cast<wasm::Store>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pSVar8->valueType).id);
        (pSVar8->valueType).id = TVar3.id;
        break;
      case ConstId:
        Expression::cast<wasm::Const>((Expression *)get);
        break;
      case UnaryId:
        Expression::cast<wasm::Unary>((Expression *)get);
        break;
      case BinaryId:
        Expression::cast<wasm::Binary>((Expression *)get);
        break;
      case SelectId:
        Expression::cast<wasm::Select>((Expression *)get);
        break;
      case DropId:
        Expression::cast<wasm::Drop>((Expression *)get);
        break;
      case ReturnId:
        Expression::cast<wasm::Return>((Expression *)get);
        break;
      case MemorySizeId:
        pMVar10 = Expression::cast<wasm::MemorySize>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pMVar10->ptrType).id);
        (pMVar10->ptrType).id = TVar3.id;
        break;
      case MemoryGrowId:
        pMVar11 = Expression::cast<wasm::MemoryGrow>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pMVar11->ptrType).id);
        (pMVar11->ptrType).id = TVar3.id;
        break;
      case NopId:
        Expression::cast<wasm::Nop>((Expression *)get);
        break;
      case UnreachableId:
        Expression::cast<wasm::Unreachable>((Expression *)get);
        break;
      case AtomicRMWId:
        Expression::cast<wasm::AtomicRMW>((Expression *)get);
        break;
      case AtomicCmpxchgId:
        Expression::cast<wasm::AtomicCmpxchg>((Expression *)get);
        break;
      case AtomicWaitId:
        pAVar9 = Expression::cast<wasm::AtomicWait>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pAVar9->expectedType).id);
        (pAVar9->expectedType).id = TVar3.id;
        break;
      case AtomicNotifyId:
        Expression::cast<wasm::AtomicNotify>((Expression *)get);
        break;
      case AtomicFenceId:
        Expression::cast<wasm::AtomicFence>((Expression *)get);
        break;
      case SIMDExtractId:
        Expression::cast<wasm::SIMDExtract>((Expression *)get);
        break;
      case SIMDReplaceId:
        Expression::cast<wasm::SIMDReplace>((Expression *)get);
        break;
      case SIMDShuffleId:
        Expression::cast<wasm::SIMDShuffle>((Expression *)get);
        break;
      case SIMDTernaryId:
        Expression::cast<wasm::SIMDTernary>((Expression *)get);
        break;
      case SIMDShiftId:
        Expression::cast<wasm::SIMDShift>((Expression *)get);
        break;
      case SIMDLoadId:
        Expression::cast<wasm::SIMDLoad>((Expression *)get);
        break;
      case SIMDLoadStoreLaneId:
        Expression::cast<wasm::SIMDLoadStoreLane>((Expression *)get);
        break;
      case MemoryInitId:
        Expression::cast<wasm::MemoryInit>((Expression *)get);
        break;
      case DataDropId:
        Expression::cast<wasm::DataDrop>((Expression *)get);
        break;
      case MemoryCopyId:
        Expression::cast<wasm::MemoryCopy>((Expression *)get);
        break;
      case MemoryFillId:
        Expression::cast<wasm::MemoryFill>((Expression *)get);
        break;
      case PopId:
        Expression::cast<wasm::Pop>((Expression *)get);
        break;
      case RefNullId:
        Expression::cast<wasm::RefNull>((Expression *)get);
        break;
      case RefIsNullId:
        Expression::cast<wasm::RefIsNull>((Expression *)get);
        break;
      case RefFuncId:
        Expression::cast<wasm::RefFunc>((Expression *)get);
        break;
      case RefEqId:
        Expression::cast<wasm::RefEq>((Expression *)get);
        break;
      case TableGetId:
        Expression::cast<wasm::TableGet>((Expression *)get);
        break;
      case TableSetId:
        Expression::cast<wasm::TableSet>((Expression *)get);
        break;
      case TableSizeId:
        Expression::cast<wasm::TableSize>((Expression *)get);
        break;
      case TableGrowId:
        Expression::cast<wasm::TableGrow>((Expression *)get);
        break;
      case TryId:
        pTVar12 = Expression::cast<wasm::Try>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pTVar12->catchBodies).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_46._4_4_ = (int)sVar20;
        do {
          cast_46._4_4_ = cast_46._4_4_ + -1;
        } while (-1 < cast_46._4_4_);
        break;
      case ThrowId:
        pTVar13 = Expression::cast<wasm::Throw>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pTVar13->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_47._4_4_ = (int)sVar20;
        do {
          cast_47._4_4_ = cast_47._4_4_ + -1;
        } while (-1 < cast_47._4_4_);
        break;
      case RethrowId:
        Expression::cast<wasm::Rethrow>((Expression *)get);
        break;
      case TupleMakeId:
        pTVar14 = Expression::cast<wasm::TupleMake>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pTVar14->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_52._4_4_ = (int)sVar20;
        do {
          cast_52._4_4_ = cast_52._4_4_ + -1;
        } while (-1 < cast_52._4_4_);
        break;
      case TupleExtractId:
        Expression::cast<wasm::TupleExtract>((Expression *)get);
        break;
      case I31NewId:
        Expression::cast<wasm::I31New>((Expression *)get);
        break;
      case I31GetId:
        Expression::cast<wasm::I31Get>((Expression *)get);
        break;
      case CallRefId:
        pCVar15 = Expression::cast<wasm::CallRef>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pCVar15->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_56._4_4_ = (int)sVar20;
        do {
          cast_56._4_4_ = cast_56._4_4_ + -1;
        } while (-1 < cast_56._4_4_);
        break;
      case RefTestId:
        pRVar16 = Expression::cast<wasm::RefTest>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pRVar16->castType).id);
        (pRVar16->castType).id = TVar3.id;
        break;
      case RefCastId:
        Expression::cast<wasm::RefCast>((Expression *)get);
        break;
      case BrOnId:
        pBVar17 = Expression::cast<wasm::BrOn>((Expression *)get);
        TVar3 = getNew(wasm::Type_(this,(pBVar17->castType).id);
        (pBVar17->castType).id = TVar3.id;
        break;
      case StructNewId:
        pSVar18 = Expression::cast<wasm::StructNew>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pSVar18->operands).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_60._4_4_ = (int)sVar20;
        do {
          cast_60._4_4_ = cast_60._4_4_ + -1;
        } while (-1 < cast_60._4_4_);
        break;
      case StructGetId:
        Expression::cast<wasm::StructGet>((Expression *)get);
        break;
      case StructSetId:
        Expression::cast<wasm::StructSet>((Expression *)get);
        break;
      case ArrayNewId:
        Expression::cast<wasm::ArrayNew>((Expression *)get);
        break;
      case ArrayNewSegId:
        Expression::cast<wasm::ArrayNewSeg>((Expression *)get);
        break;
      case ArrayNewFixedId:
        pAVar19 = Expression::cast<wasm::ArrayNewFixed>((Expression *)get);
        sVar20 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                           (&(pAVar19->values).
                             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           );
        cast_65._4_4_ = (int)sVar20;
        do {
          cast_65._4_4_ = cast_65._4_4_ + -1;
        } while (-1 < cast_65._4_4_);
        break;
      case ArrayGetId:
        Expression::cast<wasm::ArrayGet>((Expression *)get);
        break;
      case ArraySetId:
        Expression::cast<wasm::ArraySet>((Expression *)get);
        break;
      case ArrayLenId:
        Expression::cast<wasm::ArrayLen>((Expression *)get);
        break;
      case ArrayCopyId:
        Expression::cast<wasm::ArrayCopy>((Expression *)get);
        break;
      case ArrayFillId:
        Expression::cast<wasm::ArrayFill>((Expression *)get);
        break;
      case ArrayInitId:
        Expression::cast<wasm::ArrayInit>((Expression *)get);
        break;
      case RefAsId:
        Expression::cast<wasm::RefAs>((Expression *)get);
        break;
      case StringNewId:
        Expression::cast<wasm::StringNew>((Expression *)get);
        break;
      case StringConstId:
        Expression::cast<wasm::StringConst>((Expression *)get);
        break;
      case StringMeasureId:
        Expression::cast<wasm::StringMeasure>((Expression *)get);
        break;
      case StringEncodeId:
        Expression::cast<wasm::StringEncode>((Expression *)get);
        break;
      case StringConcatId:
        Expression::cast<wasm::StringConcat>((Expression *)get);
        break;
      case StringEqId:
        Expression::cast<wasm::StringEq>((Expression *)get);
        break;
      case StringAsId:
        Expression::cast<wasm::StringAs>((Expression *)get);
        break;
      case StringWTF8AdvanceId:
        Expression::cast<wasm::StringWTF8Advance>((Expression *)get);
        break;
      case StringWTF16GetId:
        Expression::cast<wasm::StringWTF16Get>((Expression *)get);
        break;
      case StringIterNextId:
        Expression::cast<wasm::StringIterNext>((Expression *)get);
        break;
      case StringIterMoveId:
        Expression::cast<wasm::StringIterMove>((Expression *)get);
        break;
      case StringSliceWTFId:
        Expression::cast<wasm::StringSliceWTF>((Expression *)get);
        break;
      case StringSliceIterId:
        Expression::cast<wasm::StringSliceIter>((Expression *)get);
      }
    }
    else {
      local_38[1] = 0;
      bVar1 = wasm::Type::operator!=
                        (&(local_30->super_SpecificExpression<(wasm::Expression::Id)9>).
                          super_Expression.type,local_38 + 1);
      local_3b9 = false;
      if (bVar1) {
        local_38[0] = unreachable;
        local_3b9 = wasm::Type::operator!=
                              (&(local_30->super_SpecificExpression<(wasm::Expression::Id)9>).
                                super_Expression.type,local_38);
      }
      if (local_3b9 != false) {
        pFVar2 = Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::
                 getFunction((Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>
                              *)((long)this + 0x30));
        TVar3 = Function::getLocalType(pFVar2,local_30->index);
        (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar3.id
        ;
      }
    }
  }
  else {
    pFVar2 = Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_>::getFunction
                       ((Walker<CodeUpdater,_wasm::UnifiedExpressionVisitor<CodeUpdater,_void>_> *)
                        ((long)this + 0x30));
    TVar3 = Function::getLocalType(pFVar2,local_20->index);
    (get->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = TVar3.id;
  }
  return;
}

Assistant:

void visitExpression(Expression* curr) {
      // local.get and local.tee are special in that their type is tied to the
      // type of the local in the function, which is tied to the signature. That
      // means we must update it based on the signature, and not on the old type
      // in the local.
      //
      // We have already updated function signatures by the time we get here,
      // which means we can just apply the current local type that we see (there
      // is no need to call getNew(), which we already did on the function's
      // signature itself).
      if (auto* get = curr->dynCast<LocalGet>()) {
        curr->type = getFunction()->getLocalType(get->index);
        return;
      } else if (auto* tee = curr->dynCast<LocalSet>()) {
        // Rule out a local.set and unreachable code.
        if (tee->type != Type::none && tee->type != Type::unreachable) {
          curr->type = getFunction()->getLocalType(tee->index);
        }
        return;
      }

      // Update the type to the new one.
      curr->type = getNew(curr->type);

      // Update any other type fields as well.

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id) [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_TYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_HEAPTYPE(id, field) cast->field = getNew(cast->field);

#define DELEGATE_FIELD_CHILD(id, field)
#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)
#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
    }